

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyIntegerGreaterOrEqual2
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,GLint reference1
          )

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[2]> floatVector2;
  StateQueryMemoryWriteGuard<float[2]> local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1b8.m_postguard[0] = -8.0297587e+18;
  local_1b8.m_postguard[1] = -8.0297587e+18;
  local_1b8.m_preguard[0] = -8.0297587e+18;
  local_1b8.m_preguard[1] = -8.0297587e+18;
  local_1b8.m_value[0] = -8.0297587e+18;
  local_1b8.m_value[1] = -8.0297587e+18;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1b8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                    (&local_1b8,testCtx);
  if ((bVar1) &&
     ((local_1b8.m_value[0] < (float)reference0 || (local_1b8.m_value[1] < (float)reference1)))) {
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected greater or equal to ",0x27);
    std::ostream::_M_insert<double>((double)reference0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)reference1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::_M_insert<double>((double)local_1b8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)local_1b8.m_value[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyIntegerGreaterOrEqual2 (tcu::TestContext& testCtx, GLenum name, GLint reference0, GLint reference1)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[2]> floatVector2;
	glGetFloatv(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] < GLfloat(reference0) || floatVector2[1] < GLfloat(reference1))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << GLfloat(reference0) << ", " << GLfloat(reference1) << "; got " << floatVector2[0] << ", " << floatVector2[1] << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}